

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgx_enc.c
# Opt level: O3

int pgx_encode(jas_image_t *image,jas_stream_t *out,char *optstr)

{
  int iVar1;
  jas_image_cmpt_t *pjVar2;
  uchar *puVar3;
  _Bool _Var4;
  uint cmptno;
  int iVar5;
  uint uVar6;
  int iVar7;
  jas_matrix_t *data;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  char *pcVar11;
  int iVar12;
  int iVar13;
  pgx_hdr_t local_68;
  ulong local_40;
  ulong local_38;
  
  if ((image->clrspc_ & 0xffffff00U) == 0x300) {
    cmptno = jas_image_getcmptbytype(image,0);
    if ((int)cmptno < 0) {
      pcVar11 = "error: missing color component\n";
    }
    else {
      if (image->numcmpts_ < 2) {
        pjVar2 = image->cmpts_[cmptno];
        if (pjVar2->prec_ < 0x11) {
          local_68.sgnd = pjVar2->sgnd_ != 0;
          local_68.magic = 0x5047;
          local_68.bigendian = true;
          local_68.prec = (uint_fast32_t)pjVar2->prec_;
          local_68.width = pjVar2->width_;
          local_68.height = pjVar2->height_;
          iVar5 = jas_getdbglevel();
          uVar8 = 0x5047;
          if (9 < iVar5) {
            pgx_dumphdr(_stderr,&local_68);
            uVar8 = local_68.magic;
          }
          jas_stream_printf(out,"%c%c",uVar8 >> 8,uVar8 & 0xff);
          pcVar11 = "PLM";
          if (local_68.bigendian != false) {
            pcVar11 = "XML";
          }
          pcVar9 = "+";
          if (local_68.sgnd != false) {
            pcVar9 = "-";
          }
          jas_stream_printf(out," %s %s %d %ld %ld\n",pcVar11 + 1,pcVar9,local_68.prec,
                            local_68.width,local_68.height);
          if ((out->flags_ & 2) != 0) {
            return -1;
          }
          data = jas_matrix_create(1,local_68.width);
          if (data == (jas_matrix_t *)0x0) {
            return -1;
          }
          if (local_68.height != 0) {
            uVar10 = 0;
            uVar8 = local_68.width;
            do {
              local_38 = uVar10;
              iVar5 = jas_image_readcmpt(image,cmptno,0,uVar10,uVar8,1,data);
              if (iVar5 != 0) {
LAB_0013563f:
                jas_matrix_destroy(data);
                return -1;
              }
              if (local_68.width == 0) {
                uVar8 = 0;
              }
              else {
                uVar10 = 0;
                uVar8 = local_68.width;
                do {
                  _Var4 = local_68.bigendian;
                  uVar6 = 1 << ((byte)local_68.prec & 0x1f);
                  if (local_68.sgnd == false) {
                    uVar6 = 0;
                  }
                  iVar5 = (int)local_68.prec;
                  iVar13 = iVar5 + 0xe;
                  if (-1 < iVar5 + 7) {
                    iVar13 = iVar5 + 7;
                  }
                  if (0 < iVar5) {
                    uVar6 = ~(-1 << ((byte)local_68.prec & 0x1f)) &
                            (int)(*data->rows_)[uVar10] +
                            ((uint)((*data->rows_)[uVar10] >> 0x3f) & uVar6);
                    iVar13 = iVar13 >> 3;
                    iVar5 = 1;
                    if (1 < iVar13) {
                      iVar5 = iVar13;
                    }
                    iVar12 = 0;
                    local_40 = uVar10;
                    do {
                      iVar13 = iVar13 + -1;
                      iVar7 = iVar12;
                      if (_Var4 != false) {
                        iVar7 = iVar13;
                      }
                      if ((out->flags_ & 7U) != 0) goto LAB_0013563f;
                      if ((-1 < out->rwlimit_) && (out->rwlimit_ <= out->rwcnt_)) {
                        out->flags_ = out->flags_ | 4;
                        goto LAB_0013563f;
                      }
                      *(byte *)&out->bufmode_ = (byte)out->bufmode_ | 0x20;
                      iVar1 = out->cnt_;
                      out->cnt_ = iVar1 + -1;
                      if (iVar1 < 1) {
                        iVar7 = jas_stream_flushbuf(out,uVar6 >> ((byte)(iVar7 << 3) & 0x3f) & 0xff)
                        ;
                        if (iVar7 == -1) goto LAB_0013563f;
                      }
                      else {
                        out->rwcnt_ = out->rwcnt_ + 1;
                        puVar3 = out->ptr_;
                        out->ptr_ = puVar3 + 1;
                        *puVar3 = (uchar)(uVar6 >> ((byte)(iVar7 << 3) & 0x3f));
                      }
                      iVar12 = iVar12 + 1;
                      uVar10 = local_40;
                      uVar8 = local_68.width;
                    } while (iVar5 != iVar12);
                  }
                  uVar10 = uVar10 + 1;
                } while (uVar10 < uVar8);
              }
              uVar10 = local_38 + 1;
            } while (uVar10 < local_68.height);
          }
          jas_matrix_destroy(data);
          return 0;
        }
      }
      pcVar11 = "The PGX format cannot be used to represent an image with this geometry.\n";
    }
  }
  else {
    pcVar11 = "error: PGX format does not support color space\n";
  }
  jas_eprintf(pcVar11);
  return -1;
}

Assistant:

int pgx_encode(jas_image_t *image, jas_stream_t *out, const char *optstr)
{
	pgx_hdr_t hdr;
	uint_fast32_t width;
	uint_fast32_t height;
	bool sgnd;
	int prec;
	pgx_enc_t encbuf;
	pgx_enc_t *enc = &encbuf;

	/* Avoid compiler warnings about unused parameters. */
	(void)optstr;

	switch (jas_clrspc_fam(jas_image_clrspc(image))) {
	case JAS_CLRSPC_FAM_GRAY:
		if ((enc->cmpt = jas_image_getcmptbytype(image,
		  JAS_IMAGE_CT_COLOR(JAS_CLRSPC_CHANIND_GRAY_Y))) < 0) {
			jas_eprintf("error: missing color component\n");
			return -1;
		}
		break;
	default:
		jas_eprintf("error: PGX format does not support color space\n");
		return -1;
		break;
	}

	width = jas_image_cmptwidth(image, enc->cmpt);
	height = jas_image_cmptheight(image, enc->cmpt);
	prec = jas_image_cmptprec(image, enc->cmpt);
	sgnd = jas_image_cmptsgnd(image, enc->cmpt);

	/* The PGX format is quite limited in the set of image geometries
	  that it can handle.  Here, we check to ensure that the image to
	  be saved can actually be represented reasonably accurately using the
	  PGX format. */
	/* There must be exactly one component. */
	if (jas_image_numcmpts(image) > 1 || prec > 16) {
		jas_eprintf("The PGX format cannot be used to represent an image with this geometry.\n");
		return -1;
	}

	hdr.magic = PGX_MAGIC;
	hdr.bigendian = true;
	hdr.sgnd = sgnd;
	hdr.prec = prec;
	hdr.width = width;
	hdr.height = height;

	if (jas_getdbglevel() >= 10) {
		pgx_dumphdr(stderr, &hdr);
	}

	if (pgx_puthdr(out, &hdr)) {
		return -1;
	}

	if (pgx_putdata(out, &hdr, image, enc->cmpt)) {
		return -1;
	}

	return 0;
}